

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptor::CopyTo(FileDescriptor *this,FileDescriptorProto *proto)

{
  int iVar1;
  string *psVar2;
  ulong uVar3;
  FileDescriptor *this_00;
  Descriptor *this_01;
  DescriptorProto *proto_00;
  EnumDescriptor *this_02;
  EnumDescriptorProto *proto_01;
  ServiceDescriptor *this_03;
  ServiceDescriptorProto *proto_02;
  FieldDescriptor *this_04;
  FieldDescriptorProto *proto_03;
  FileOptions *pFVar4;
  FileOptions *pFVar5;
  int local_34;
  int local_30;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  FileDescriptorProto *proto_local;
  FileDescriptor *this_local;
  
  psVar2 = name_abi_cxx11_(this);
  FileDescriptorProto::set_name(proto,psVar2);
  package_abi_cxx11_(this);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    psVar2 = package_abi_cxx11_(this);
    FileDescriptorProto::set_package(proto,psVar2);
  }
  i_2 = 0;
  while( true ) {
    iVar1 = dependency_count(this);
    if (iVar1 <= i_2) break;
    this_00 = dependency(this,i_2);
    psVar2 = name_abi_cxx11_(this_00);
    FileDescriptorProto::add_dependency(proto,psVar2);
    i_2 = i_2 + 1;
  }
  i_3 = 0;
  while( true ) {
    iVar1 = public_dependency_count(this);
    if (iVar1 <= i_3) break;
    FileDescriptorProto::add_public_dependency
              (proto,*(int32 *)(*(long *)(this + 0x30) + (long)i_3 * 4));
    i_3 = i_3 + 1;
  }
  i_4 = 0;
  while( true ) {
    iVar1 = weak_dependency_count(this);
    if (iVar1 <= i_4) break;
    FileDescriptorProto::add_weak_dependency
              (proto,*(int32 *)(*(long *)(this + 0x40) + (long)i_4 * 4));
    i_4 = i_4 + 1;
  }
  i_5 = 0;
  while( true ) {
    iVar1 = message_type_count(this);
    if (iVar1 <= i_5) break;
    this_01 = message_type(this,i_5);
    proto_00 = FileDescriptorProto::add_message_type(proto);
    Descriptor::CopyTo(this_01,proto_00);
    i_5 = i_5 + 1;
  }
  i_6 = 0;
  while( true ) {
    iVar1 = enum_type_count(this);
    if (iVar1 <= i_6) break;
    this_02 = enum_type(this,i_6);
    proto_01 = FileDescriptorProto::add_enum_type(proto);
    EnumDescriptor::CopyTo(this_02,proto_01);
    i_6 = i_6 + 1;
  }
  local_30 = 0;
  while( true ) {
    iVar1 = service_count(this);
    if (iVar1 <= local_30) break;
    this_03 = service(this,local_30);
    proto_02 = FileDescriptorProto::add_service(proto);
    ServiceDescriptor::CopyTo(this_03,proto_02);
    local_30 = local_30 + 1;
  }
  local_34 = 0;
  while( true ) {
    iVar1 = extension_count(this);
    if (iVar1 <= local_34) break;
    this_04 = extension(this,local_34);
    proto_03 = FileDescriptorProto::add_extension(proto);
    FieldDescriptor::CopyTo(this_04,proto_03);
    local_34 = local_34 + 1;
  }
  pFVar4 = options(this);
  pFVar5 = FileOptions::default_instance();
  if (pFVar4 != pFVar5) {
    pFVar4 = FileDescriptorProto::mutable_options(proto);
    pFVar5 = options(this);
    FileOptions::CopyFrom(pFVar4,pFVar5);
  }
  return;
}

Assistant:

void FileDescriptor::CopyTo(FileDescriptorProto* proto) const {
  proto->set_name(name());
  if (!package().empty()) proto->set_package(package());

  for (int i = 0; i < dependency_count(); i++) {
    proto->add_dependency(dependency(i)->name());
  }

  for (int i = 0; i < public_dependency_count(); i++) {
    proto->add_public_dependency(public_dependencies_[i]);
  }

  for (int i = 0; i < weak_dependency_count(); i++) {
    proto->add_weak_dependency(weak_dependencies_[i]);
  }

  for (int i = 0; i < message_type_count(); i++) {
    message_type(i)->CopyTo(proto->add_message_type());
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->CopyTo(proto->add_enum_type());
  }
  for (int i = 0; i < service_count(); i++) {
    service(i)->CopyTo(proto->add_service());
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyTo(proto->add_extension());
  }

  if (&options() != &FileOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}